

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

_Bool Mips64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  int feature;
  cs_detail *__s;
  DecodeStatus DVar1;
  undefined8 in_RAX;
  uint32_t local_34;
  
  local_34 = (uint32_t)((ulong)in_RAX >> 0x20);
  feature = *(int *)(ud + 4);
  readInstruction32(code,&local_34,*(_Bool *)(ud + 0x28),false);
  __s = instr->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  DVar1 = decodeInstruction(DecoderTableMips6432,instr,local_34,address,(MCRegisterInfo *)info,
                            feature);
  if ((DVar1 == MCDisassembler_Fail) &&
     (DVar1 = decodeInstruction(DecoderTableMips32,instr,local_34,address,(MCRegisterInfo *)info,
                                feature), DVar1 == MCDisassembler_Fail)) {
    return false;
  }
  *size = 4;
  return DVar1 == MCDisassembler_Success;
}

Assistant:

bool Mips64_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	cs_struct *handle = (cs_struct *)(uintptr_t)ud;

	DecodeStatus status = Mips64Disassembler_getInstruction(handle->mode, instr,
			code, code_len,
			size,
			address, handle->big_endian, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}